

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O0

int isotree_set_reference_points
              (void *isotree_model,uint8_t with_distances,size_t nrows,uint8_t is_col_major,
              double *numeric_data,size_t ld_numeric,int *categ_data,size_t ld_categ,uint8_t is_csc,
              double *csc_values,int *csc_indices,int *csc_indptr)

{
  ostream *this;
  long in_RDI;
  int *unaff_retaddr;
  undefined7 in_stack_00000008;
  bool in_stack_0000000f;
  exception *e;
  double *in_stack_00000018;
  IsolationForest *in_stack_00000020;
  IsolationForest *model;
  undefined7 in_stack_00000040;
  bool with_distances_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDI == 0) {
    this = std::operator<<((ostream *)&std::cerr,
                           "Passed NULL \'isotree_model\' to \'isotree_serialize_to_file\'.");
    std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
    iVar1 = 1;
  }
  else {
    with_distances_00 = SUB81((ulong)in_RDI >> 0x38,0);
    if (ld_numeric == 0) {
      isotree::IsolationForest::set_as_reference_points
                (in_stack_00000020,in_stack_00000018,(int *)e,in_stack_0000000f,
                 (size_t)unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                 ,CONCAT17(is_col_major,in_stack_00000040),with_distances_00);
    }
    else {
      isotree::IsolationForest::set_as_reference_points
                (in_stack_00000020,in_stack_00000018,(int *)e,
                 (int *)CONCAT17(in_stack_0000000f,in_stack_00000008),unaff_retaddr,
                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),with_distances_00);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

ISOTREE_EXPORTED
int isotree_set_reference_points
(
    void* isotree_model,
    uint8_t with_distances,
    size_t nrows,
    uint8_t is_col_major,
    double *numeric_data,
    size_t ld_numeric,
    int *categ_data,
    size_t ld_categ,
    uint8_t is_csc,
    double *csc_values,
    int *csc_indices,
    int *csc_indptr
)
{
    if (!isotree_model) {
        cerr << "Passed NULL 'isotree_model' to 'isotree_serialize_to_file'." << std::endl;
        return IsoTreeError;
    }

    IsolationForest *model = (IsolationForest*)isotree_model;
    try
    {
        if (csc_indptr == NULL)
            model->set_as_reference_points(numeric_data, categ_data, (bool)is_col_major,
                                           nrows, ld_numeric, ld_categ,
                                           (bool)with_distances);
        else
            model->set_as_reference_points(csc_values, csc_indices, csc_indptr, categ_data,
                                           nrows, (bool)with_distances);
        return IsoTreeSuccess;
    }

    catch (std::exception &e)
    {
        cerr << e.what();
        cerr.flush();
    }

    return IsoTreeError;
}